

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prompts.c
# Opt level: O0

prompts_t * new_prompts(void)

{
  prompts_t *ppVar1;
  SeatPromptResult local_30;
  prompts_t *local_10;
  prompts_t *p;
  
  ppVar1 = (prompts_t *)safemalloc(1,0x80,0);
  ppVar1->prompts = (prompt_t **)0x0;
  ppVar1->prompts_size = 0;
  ppVar1->n_prompts = 0;
  ppVar1->data = (void *)0x0;
  local_10 = ppVar1;
  make_spr_simple(&local_30,SPRK_INCOMPLETE);
  (ppVar1->spr).kind = local_30.kind;
  *(undefined4 *)&(ppVar1->spr).field_0x4 = local_30._4_4_;
  (ppVar1->spr).errfn = local_30.errfn;
  (ppVar1->spr).errdata_lit = local_30.errdata_lit;
  (ppVar1->spr).errdata_u = local_30.errdata_u;
  *(undefined4 *)&(ppVar1->spr).field_0x1c = local_30._28_4_;
  local_10->to_server = true;
  local_10->instruction = (char *)0x0;
  local_10->name = (char *)0x0;
  local_10->instr_reqd = false;
  local_10->name_reqd = false;
  local_10->callback = (toplevel_callback_fn_t)0x0;
  local_10->callback_ctx = (void *)0x0;
  local_10->ldisc_ptr_to_us = (prompts_t **)0x0;
  return local_10;
}

Assistant:

prompts_t *new_prompts(void)
{
    prompts_t *p = snew(prompts_t);
    p->prompts = NULL;
    p->n_prompts = p->prompts_size = 0;
    p->data = NULL;
    p->spr = SPR_INCOMPLETE;
    p->to_server = true; /* to be on the safe side */
    p->name = p->instruction = NULL;
    p->name_reqd = p->instr_reqd = false;
    p->callback = NULL;
    p->callback_ctx = NULL;
    p->ldisc_ptr_to_us = NULL;
    return p;
}